

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>::addHandler
          (PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)> *this,
          function<void_(const_QList<QByteArray>_&)> *handler)

{
  QThread *local_58;
  pair<QPointer<QThread>,_std::function<void_(const_QList<QByteArray>_&)>_> local_50;
  QWriteLocker local_20;
  QWriteLocker lock;
  function<void_(const_QList<QByteArray>_&)> *handler_local;
  PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)> *this_local;
  
  lock.q_val = (quintptr)handler;
  QWriteLocker::QWriteLocker(&local_20,&this->m_lock);
  local_58 = (QThread *)QThread::currentThread();
  std::pair<QPointer<QThread>,_std::function<void_(const_QList<QByteArray>_&)>_>::
  pair<QThread_*,_std::function<void_(const_QList<QByteArray>_&)>,_true>
            (&local_50,&local_58,handler);
  QList<std::pair<QPointer<QThread>,_std::function<void_(const_QList<QByteArray>_&)>_>_>::append
            ((QList<std::pair<QPointer<QThread>,_std::function<void_(const_QList<QByteArray>_&)>_>_>
              *)&this->m_handlers,&local_50);
  std::pair<QPointer<QThread>,_std::function<void_(const_QList<QByteArray>_&)>_>::~pair(&local_50);
  QWriteLocker::~QWriteLocker(&local_20);
  return;
}

Assistant:

void addHandler(std::function<F> handler)
    {
        QWriteLocker lock{&m_lock};
        m_handlers.append({QThread::currentThread(), std::move(handler)});
    }